

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenType.cpp
# Opt level: O3

void __thiscall tokenType::tokenType(tokenType *this,string *name,tokenCategory type)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->type = type;
  return;
}

Assistant:

tokenType::tokenType(string name, enum tokenCategory type) {
    this->name = name;
    this->type = type;
}